

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::addTextToBuffer
          (DebugInfoRenderer *this,string *text,int yOffset)

{
  unsigned_short uVar1;
  vector<float,_std::allocator<float>_> *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int x;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  unsigned_short local_9e;
  float ay;
  long local_98;
  float bx;
  float ax;
  float by;
  string *local_80;
  DebugInfoRenderer *local_78;
  ulong local_70;
  ulong local_68;
  vector<float,_std::allocator<float>_> *local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = text;
  local_78 = this;
  if (addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&addTextToBuffer(std::__cxx11::string_const&,int)::
                                 charsStr_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                 "0123456789.:/",(allocator<char> *)&ay);
      __cxa_atexit(std::__cxx11::string::~string,
                   &addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_);
    }
  }
  uVar3 = (ulong)(uint)(yOffset << 3);
  local_60 = &local_78->m_posBuf;
  local_58 = &local_78->m_ndxBuf;
  local_70 = 0;
  local_68 = uVar3;
  for (local_98 = 0; local_98 < (int)local_80->_M_string_length; local_98 = local_98 + 1) {
    lVar9 = local_70 + 1;
    uVar8 = 0;
    iVar2 = std::__cxx11::string::find('p',(ulong)(uint)(int)(local_80->_M_dataplus)._M_p[local_98])
    ;
    uVar4 = (ulong)(uint)(iVar2 * 6);
    lVar5 = local_98 * 8;
    local_50 = lVar5;
    local_48 = lVar9;
    while (uVar6 = (uint)uVar8, uVar6 != 6) {
      ay = (float)(int)(uVar6 | (uint)uVar3) * 0.1 * 0.125 + -1.0;
      uVar8 = (ulong)(uVar6 + 1);
      by = (float)(int)(uVar6 + (uint)uVar3 + 1) * 0.1 * 0.125 + -1.0;
      local_40 = uVar4;
      local_38 = uVar8;
      for (lVar7 = 0; this_01 = local_58, lVar7 != 6; lVar7 = lVar7 + 1) {
        uVar6 = (uint)lVar7;
        ax = 1.0 - (float)(int)(uVar6 | (uint)lVar5) * 0.1 * 0.125;
        bx = 1.0 - (float)(int)((int)lVar9 + uVar6) * 0.1 * 0.125;
        if (" ####    #   #### #####    #  ###### ########### ####  ####         ##       ##    #  ##  #    #     #  #   #     #         # #    ##    #        ##      # #    #   #      #   ###  #  #  #### # ###    #   ####  #####               #  #    #   #     #       #######     ###   #  #   #    #     #        ##    #   #    #   #    #   #    #    # #    ##    # #    #    #   ##   ##    ##   #     ####   ### ###### ####     #  ####  #### #      #### ###     ##        #     "
            [(int)((int)uVar4 + uVar6)] != ' ') {
          uVar3 = (ulong)((long)(local_78->m_posBuf).
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(local_78->m_posBuf).
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
          uVar1 = (unsigned_short)
                  ((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 2);
          local_9e = uVar1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (local_58,&local_9e);
          local_9e = uVar1 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (this_01,&local_9e);
          local_9e = uVar1 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (this_01,&local_9e);
          local_9e = uVar1 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (this_01,&local_9e);
          local_9e = uVar1 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (this_01,&local_9e);
          local_9e = uVar1 + 3;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (this_01,&local_9e);
          this_00 = local_60;
          std::vector<float,_std::allocator<float>_>::push_back(local_60,&ax);
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&ay);
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&bx);
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&ay);
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&ax);
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&by);
          lVar9 = local_48;
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&bx);
          uVar8 = local_38;
          std::vector<float,_std::allocator<float>_>::push_back(this_00,&by);
          uVar4 = local_40;
          lVar5 = local_50;
        }
      }
      uVar4 = uVar4 + 0x4e;
      uVar3 = local_68;
    }
    local_70 = (ulong)((int)local_70 + 8);
  }
  return;
}

Assistant:

void DebugInfoRenderer::addTextToBuffer (const string& text, const int yOffset)
{
	static const char		characters[]	= "0123456789.:/";
	const int				numCharacters	= DE_LENGTH_OF_ARRAY(characters)-1; // \note -1 for null byte.
	const int				charWid			= 6;
	const int				charHei			= 6;
	static const string		charsStr		(characters);

	static const char font[numCharacters*charWid*charHei + 1]=
		" #### ""   #  "" #### ""##### ""   #  ""######"" #####""######"" #### "" #### ""      ""  ##  ""     #"
		"#    #""  ##  ""#    #""     #""  #   ""#     ""#     ""    # ""#    #""#    #""      ""  ##  ""    # "
		"#    #""   #  ""    # ""  ### "" #  # "" #### ""# ### ""   #  "" #### "" #####""      ""      ""   #  "
		"#    #""   #  ""   #  ""     #""######""     #""##   #""  #   ""#    #""     #""      ""  ##  ""  #   "
		"#    #""   #  ""  #   ""#    #""    # ""#    #""#    #"" #    ""#    #""   ## ""  ##  ""  ##  "" #    "
		" #### ""  ### ""######"" #### ""    # "" #### "" #### ""#     "" #### ""###   ""  ##  ""      ""#     ";

	for (int ndxInText = 0; ndxInText < (int)text.size(); ndxInText++)
	{
		const int ndxInCharset	= (int)charsStr.find(text[ndxInText]);
		DE_ASSERT(ndxInCharset < numCharacters);
		const int fontXStart	= ndxInCharset*charWid;

		for (int y = 0; y < charHei; y++)
		{
			float ay = -1.0f + (float)(y + 0 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			float by = -1.0f + (float)(y + 1 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			for (int x = 0; x < charWid; x++)
			{
				// \note Text is mirrored in x direction since on most(?) mobile devices the image is mirrored(?).
				float ax = 1.0f - (float)(x + 0 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);
				float bx = 1.0f - (float)(x + 1 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);

				if (font[y*numCharacters*charWid + fontXStart + x] != ' ')
				{
					const int vtxNdx = (int)m_posBuf.size()/2;

					m_ndxBuf.push_back(deUint16(vtxNdx+0));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+2));

					m_ndxBuf.push_back(deUint16(vtxNdx+2));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+3));

					m_posBuf.push_back(ax);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(ax);
					m_posBuf.push_back(by);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(by);
				}
			}
		}
	}
}